

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

int __thiscall
zmq::options_t::set_curve_key(options_t *this,uint8_t *destination_,void *optval_,size_t optvallen_)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint8_t *puVar4;
  string s;
  char z85_key [41];
  
  if (optvallen_ == 0x29) {
    s._M_dataplus._M_p = (pointer)&s.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&s,optval_,(long)optval_ + 0x29);
    puVar4 = zmq_z85_decode(destination_,s._M_dataplus._M_p);
    if (puVar4 == (uint8_t *)0x0) {
      std::__cxx11::string::~string((string *)&s);
      return -1;
    }
    this->mechanism = 2;
    std::__cxx11::string::~string((string *)&s);
  }
  else {
    if (optvallen_ == 0x28) {
      z85_key._32_8_ = *(undefined8 *)((long)optval_ + 0x20);
      z85_key._0_8_ = *optval_;
      z85_key._8_8_ = *(undefined8 *)((long)optval_ + 8);
      z85_key._16_8_ = *(undefined8 *)((long)optval_ + 0x10);
      z85_key._24_8_ = *(undefined8 *)((long)optval_ + 0x18);
      z85_key[0x28] = '\0';
      puVar4 = zmq_z85_decode(destination_,z85_key);
      if (puVar4 == (uint8_t *)0x0) {
        return -1;
      }
    }
    else {
      if (optvallen_ != 0x20) {
        return -1;
      }
      uVar1 = *optval_;
      uVar2 = *(undefined8 *)((long)optval_ + 8);
      uVar3 = *(undefined8 *)((long)optval_ + 0x18);
      *(undefined8 *)(destination_ + 0x10) = *(undefined8 *)((long)optval_ + 0x10);
      *(undefined8 *)(destination_ + 0x18) = uVar3;
      *(undefined8 *)destination_ = uVar1;
      *(undefined8 *)(destination_ + 8) = uVar2;
    }
    this->mechanism = 2;
  }
  return 0;
}

Assistant:

int zmq::options_t::set_curve_key (uint8_t *destination_,
                                   const void *optval_,
                                   size_t optvallen_)
{
    switch (optvallen_) {
        case CURVE_KEYSIZE:
            memcpy (destination_, optval_, optvallen_);
            mechanism = ZMQ_CURVE;
            return 0;

        case CURVE_KEYSIZE_Z85 + 1: {
            const std::string s (static_cast<const char *> (optval_),
                                 optvallen_);

            if (zmq_z85_decode (destination_, s.c_str ())) {
                mechanism = ZMQ_CURVE;
                return 0;
            }
            break;
        }

        case CURVE_KEYSIZE_Z85:
            char z85_key[CURVE_KEYSIZE_Z85 + 1];
            memcpy (z85_key, reinterpret_cast<const char *> (optval_),
                    optvallen_);
            z85_key[CURVE_KEYSIZE_Z85] = 0;
            if (zmq_z85_decode (destination_, z85_key)) {
                mechanism = ZMQ_CURVE;
                return 0;
            }
            break;

        default:
            break;
    }
    return -1;
}